

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall libserver::server::_write_to_socket(server *this,string *_send_message)

{
  ostream *this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  error_category *peVar2;
  error_code ec_00;
  error_code ec;
  error_category local_28;
  const_buffers_1 local_18;
  
  peVar2 = &local_28;
  local_28._vptr_error_category._0_4_ = 0;
  local_28._vptr_error_category._4_4_ = local_28._vptr_error_category._4_4_ & 0xffffff00;
  local_28.id_ = (ulong_long_type)&boost::system::detail::cat_holder<void>::system_category_instance
  ;
  local_18.super_const_buffer.data_ = (_send_message->_M_dataplus)._M_p;
  local_18.super_const_buffer.size_ = _send_message->_M_string_length;
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1,boost::asio::detail::transfer_exactly_t>
            (&this->socket,&local_18,(transfer_exactly_t)local_18.super_const_buffer.size_,&local_28
            );
  if (local_28._vptr_error_category._4_1_ == '\x01') {
    this_00 = std::operator<<((ostream *)&std::cout,"Error while writing ");
    ec_00.cat_ = peVar2;
    ec_00.val_ = (undefined4)local_28.id_;
    ec_00.failed_ = (bool)local_28.id_._4_1_;
    ec_00._5_3_ = local_28.id_._5_3_;
    pbVar1 = boost::system::operator<<
                       ((system *)this_00,
                        (basic_ostream<char,_std::char_traits<char>_> *)
                        CONCAT44(local_28._vptr_error_category._4_4_,
                                 local_28._vptr_error_category._0_4_),ec_00);
    std::endl<char,std::char_traits<char>>((ostream *)pbVar1);
  }
  return;
}

Assistant:

void libserver::server::_write_to_socket(const std::string& _send_message)
{   
    boost::system::error_code ec;
    boost::asio::write(socket,boost::asio::buffer(_send_message),boost::asio::transfer_exactly(_send_message.length()),&ec);

    if(ec)
    {
        std::cout<<"Error while writing "<<ec<<std::endl;
    }

}